

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void MOJOSHADER_glGetPixelShaderUniformB(uint idx,int *data,uint bcount)

{
  MOJOSHADER_glContext *pMVar1;
  ulong uVar2;
  ulong uVar3;
  
  pMVar1 = ctx;
  if (idx < 0x1ff) {
    uVar2 = (ulong)(0x1ff - idx);
    if (bcount <= 0x1ff - idx) {
      uVar2 = (ulong)bcount;
    }
    if ((int)uVar2 != 0) {
      uVar3 = 0;
      do {
        data[uVar3] = (uint)pMVar1->ps_reg_file_b[uVar3 + idx];
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
  }
  return;
}

Assistant:

void MOJOSHADER_glGetPixelShaderUniformB(unsigned int idx, int *data,
                                         unsigned int bcount)
{
    const uint maxregs = STATICARRAYLEN(ctx->ps_reg_file_b) / 4;
    if (idx < maxregs)
    {
        uint8 *rptr = ctx->ps_reg_file_b + idx;
        uint8 *endptr = rptr + minuint(maxregs - idx, bcount);
        while (rptr != endptr)
            *(data++) = (int) *(rptr++);
    } // if
}